

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O0

void dger(int m,int n,double alpha,double *x,int incx,double *y,int incy,double *a,int lda)

{
  double dVar1;
  int iVar2;
  allocator<char> local_79;
  string local_78;
  double temp;
  int local_48;
  int kx;
  int jy;
  int j;
  int ix;
  int info;
  int i;
  int incy_local;
  double *y_local;
  double *pdStack_20;
  int incx_local;
  double *x_local;
  double alpha_local;
  int n_local;
  int m_local;
  
  j = 0;
  info = incy;
  _i = y;
  y_local._4_4_ = incx;
  pdStack_20 = x;
  x_local = (double *)alpha;
  alpha_local._0_4_ = n;
  alpha_local._4_4_ = m;
  if (m < 0) {
    j = 1;
  }
  else if (n < 0) {
    j = 2;
  }
  else if (incx == 0) {
    j = 5;
  }
  else if (incy == 0) {
    j = 7;
  }
  else {
    iVar2 = i4_max(1,m);
    if (lda < iVar2) {
      j = 9;
    }
  }
  if (j == 0) {
    if (((alpha_local._4_4_ != 0) && (alpha_local._0_4_ != 0)) &&
       (((double)x_local != 0.0 || (NAN((double)x_local))))) {
      if (info < 1) {
        local_48 = -((alpha_local._0_4_ + -1) * info);
      }
      else {
        local_48 = 0;
      }
      if (y_local._4_4_ == 1) {
        for (kx = 0; kx < alpha_local._0_4_; kx = kx + 1) {
          if ((_i[local_48] != 0.0) || (NAN(_i[local_48]))) {
            dVar1 = _i[local_48];
            for (ix = 0; ix < alpha_local._4_4_; ix = ix + 1) {
              a[ix + kx * lda] = pdStack_20[ix] * (double)x_local * dVar1 + a[ix + kx * lda];
            }
          }
          local_48 = local_48 + info;
        }
      }
      else {
        if (y_local._4_4_ < 1) {
          temp._4_4_ = -((alpha_local._4_4_ + -1) * y_local._4_4_);
        }
        else {
          temp._4_4_ = 0;
        }
        for (kx = 0; kx < alpha_local._0_4_; kx = kx + 1) {
          if ((_i[local_48] != 0.0) || (NAN(_i[local_48]))) {
            dVar1 = _i[local_48];
            jy = temp._4_4_;
            for (ix = 0; ix < alpha_local._4_4_; ix = ix + 1) {
              a[ix + kx * lda] = pdStack_20[jy] * (double)x_local * dVar1 + a[ix + kx * lda];
              jy = jy + y_local._4_4_;
            }
          }
          local_48 = local_48 + info;
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"DGER",&local_79);
    xerbla(&local_78,j);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return;
}

Assistant:

void dger ( int m, int n, double alpha, double x[], int incx, double y[], 
  int incy, double a[], int lda )

//****************************************************************************80
//
//  Purpose:
//
//    DGER computes A := alpha*x*y' + A.
//
//  Discussion:
//
//    DGER performs the rank 1 operation
//
//      A := alpha*x*y' + A,
//
//    where alpha is a scalar, x is an m element vector, y is an n element
//    vector and A is an m by n matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    Original FORTRAN77 version by Jack Dongarra,  Jeremy Du Croz,  
//    Sven Hammarling,  Richard Hanson.
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix A.
//    0 <= M.
//
//    Input, int N, the number of columns of the matrix A.
//    0 <= N.
//
//    Input, double ALPHA, the scalar multiplier.
//
//    Input, double X[1+(M-1)*abs(INCX)], the first vector.
//
//    Input, int INCX, the increment for elements of X.
//    INCX must not be zero.
//
//    Input, double Y[1+(N-1)*abs(INCY)], the second vector.
//
//    Input, int INCY, the increment for elements of Y.
//    INCY must not be zero.
//
//    Input/output, double A[LDA*N].  On entry, the leading M by N 
//    part of the array contains the matrix of coefficients. On exit, A is
//    overwritten by the updated matrix.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, M ) <= LDA.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jy;
  int kx;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if ( m < 0 )
  {
    info = 1;
  }
  else if ( n < 0 )
  {
    info = 2;
  }
  else if ( incx == 0 )
  {
    info = 5;
  }
  else if ( incy == 0 )
  {
    info = 7;
  }
  else if ( lda < i4_max ( 1, m ) )
  {
    info = 9;
  }

  if ( info != 0 )
  {
    xerbla ( "DGER", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( m == 0 || n == 0 || alpha == 0.0 )
  {
    return;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( 0 < incy )
  {
    jy = 0;
  }
  else
  {
    jy = 0 - ( n - 1 ) * incy;
  }

  if ( incx == 1 )
  {
    for ( j = 0; j < n; j++ )
    {
      if ( y[jy] != 0.0 )
      {
        temp = alpha * y[jy];
        for ( i = 0; i < m; i++ )
        {
          a[i+j*lda] = a[i+j*lda] + x[i] * temp;
        }
      }
      jy = jy + incy;
    }
  }
  else
  {
    if ( 0 < incx )
    {
      kx = 0;
    }
    else
    {
      kx = 0 - ( m - 1 ) * incx;
    }
    for ( j = 0; j < n; j++ )
    {
      if ( y[jy] != 0.0 )
      {
        temp = alpha * y[jy];
        ix = kx;
        for ( i = 0; i < m; i++ )
        {
          a[i+j*lda] = a[i+j*lda] + x[ix] * temp;
          ix = ix + incx;
        }
      }
      jy = jy + incy;
    }
  }

  return;
}